

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopObj.c
# Opt level: O1

void Hop_ObjCreateChoice(Hop_Obj_t *pOld,Hop_Obj_t *pNew)

{
  Hop_Obj_t *in_RAX;
  Hop_Obj_t *pObj;
  Hop_Obj_t *pHVar1;
  
  if ((pOld != (Hop_Obj_t *)0x0) && (pNew != (Hop_Obj_t *)0x0)) {
    pObj = Hop_ObjRepr(in_RAX);
    pHVar1 = Hop_ObjRepr(pObj);
    if (pHVar1 != pObj) {
      (pHVar1->field_0).pData = pObj;
    }
    return;
  }
  __assert_fail("pOld != NULL && pNew != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/hop/hopObj.c"
                ,0x108,"void Hop_ObjCreateChoice(Hop_Obj_t *, Hop_Obj_t *)");
}

Assistant:

void Hop_ObjCreateChoice( Hop_Obj_t * pOld, Hop_Obj_t * pNew )
{
    Hop_Obj_t * pOldRepr;
    Hop_Obj_t * pNewRepr;
    assert( pOld != NULL && pNew != NULL );
    pOldRepr = Hop_ObjRepr(pOld);
    pNewRepr = Hop_ObjRepr(pNew);
    if ( pNewRepr != pOldRepr )
        pNewRepr->pData = pOldRepr;
}